

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DefParamAssignmentSyntax::setChild
          (DefParamAssignmentSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  logic_error *this_00;
  long *plVar3;
  long lVar4;
  size_type *psVar5;
  char *func;
  long *plVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 1) {
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar2 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar2 = *ppSVar1;
      if (pSVar2->kind != EqualsValueClause) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::EqualsValueClauseSyntax]"
                  );
      }
    }
    lVar4 = 0x18;
    if (pSVar2 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      func = 
      "slang::not_null<slang::syntax::EqualsValueClauseSyntax *>::not_null(U &&) [T = slang::syntax::EqualsValueClauseSyntax *, U = slang::syntax::EqualsValueClauseSyntax *]"
      ;
      goto LAB_0029ff47;
    }
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = plVar3[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_70,0xe92);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_b0 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar6;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_f0 == plVar6) {
        local_e0 = *plVar6;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar6;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar2 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar2 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)
               SyntaxNode::as<slang::syntax::NameSyntax>(*ppSVar1);
    }
    lVar4 = 0x10;
    if (pSVar2 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      func = 
      "slang::not_null<slang::syntax::NameSyntax *>::not_null(U &&) [T = slang::syntax::NameSyntax *, U = slang::syntax::NameSyntax *]"
      ;
LAB_0029ff47:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,func);
    }
  }
  *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)
   ((long)&(this->super_SyntaxNode).parent + lVar4) = pSVar2;
  return;
}

Assistant:

void DefParamAssignmentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: setter = child.node() ? &child.node()->as<EqualsValueClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}